

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O0

void __thiscall QXcbForeignWindow::~QXcbForeignWindow(QXcbForeignWindow *this)

{
  QXcbForeignWindow *in_stack_00000010;
  
  ~QXcbForeignWindow(in_stack_00000010);
  return;
}

Assistant:

QXcbForeignWindow::~QXcbForeignWindow()
{
    if (QPlatformWindow::parent())
        setParent(nullptr);

    // Clear window so that destroy() does not affect it
    m_window = 0;

    if (connection()->mouseGrabber() == this)
        connection()->setMouseGrabber(nullptr);
    if (connection()->mousePressWindow() == this)
        connection()->setMousePressWindow(nullptr);
}